

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Performance::anon_unknown_1::UploadWaitDrawCase::findStabilizationSample
          (UploadWaitDrawCase *this,offset_in_Result_to_deUint64 target,char *description)

{
  pointer *ppuVar1;
  pointer *ppuVar2;
  pointer puVar3;
  pointer puVar4;
  qpTestLog *pqVar5;
  int iVar6;
  char *pcVar7;
  pointer pvVar8;
  pointer pSVar9;
  long lVar10;
  ulong uVar11;
  size_t sVar12;
  int iVar13;
  unsigned_long *puVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  undefined1 auVar18 [8];
  ulong uVar19;
  undefined1 auVar20 [8];
  long lVar21;
  ulong uVar22;
  int iVar24;
  uint uVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  sampleObservations;
  vector<unsigned_long,_std::allocator<unsigned_long>_> allSamples;
  allocator_type local_209;
  undefined1 local_208 [16];
  int local_1f8;
  int local_1f4;
  char *local_1f0;
  long local_1e8;
  long local_1e0;
  int local_1d8;
  int local_1d4;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_1d0;
  UploadWaitDrawCase *local_1b8;
  undefined1 local_1b0 [8];
  TestLog *local_1a8;
  pointer local_1a0;
  ios_base local_138 [264];
  ulong uVar23;
  
  local_1f0 = description;
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector(&local_1d0,(long)(this->m_numMaxSwaps + 1),(allocator_type *)local_1b0);
  iVar16 = this->m_numMaxSwaps;
  local_1b8 = this;
  if (-1 < iVar16) {
    iVar13 = 0;
    do {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                (local_1d0.
                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + iVar13,(long)this->m_numSamplesPerSwap)
      ;
      pSVar9 = (this->m_samples).
               super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar25 = (uint)((ulong)((long)(this->m_samples).
                                    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar9) >> 4)
      ;
      if (0 < (int)uVar25) {
        puVar14 = (unsigned_long *)
                  ((long)&((this->m_results).
                           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result>_>
                           ._M_impl.super__Vector_impl_data._M_start)->uploadDuration + target);
        uVar11 = (ulong)(uVar25 & 0x7fffffff);
        iVar16 = 0;
        do {
          if (pSVar9->numFrames == iVar13) {
            lVar21 = (long)iVar16;
            iVar16 = iVar16 + 1;
            local_1d0.
            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[iVar13].
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[lVar21] = *puVar14;
          }
          pSVar9 = pSVar9 + 1;
          puVar14 = puVar14 + 5;
          uVar11 = uVar11 - 1;
        } while (uVar11 != 0);
      }
      puVar3 = local_1d0.
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar13].
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar4 = local_1d0.
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar13].
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (puVar3 != puVar4) {
        uVar11 = (long)puVar4 - (long)puVar3 >> 3;
        lVar21 = 0x3f;
        if (uVar11 != 0) {
          for (; uVar11 >> lVar21 == 0; lVar21 = lVar21 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (puVar3,puVar4,((uint)lVar21 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (puVar3,puVar4);
      }
      iVar13 = iVar13 + 1;
      iVar16 = this->m_numMaxSwaps;
    } while (iVar13 <= iVar16);
  }
  do {
    iVar13 = iVar16 + -1;
    if (iVar16 == 0) {
      local_1b0 = (undefined1  [8])
                  ((this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.
                   super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      pcVar7 = local_1f0;
      if (local_1f0 == (char *)0x0) {
        std::ios::clear((int)(ostringstream *)&local_1a8 + (int)local_1a8[-3].m_log);
      }
      else {
        sVar12 = strlen(local_1f0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar7,sVar12);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,": All samples seem to have the same distribution",0x30);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
      iVar24 = 0;
      break;
    }
    local_1e8 = (long)iVar13 * 3;
    local_1f8 = iVar16;
    local_1d4 = iVar13;
    do {
      pvVar8 = local_1d0.
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar21 = local_1e8;
      iVar13 = iVar13 + 1;
      iVar17 = this->m_numMaxSwaps;
      iVar16 = local_1d4;
      iVar24 = local_1d8;
      if (iVar17 < iVar13) goto LAB_00748c49;
      lVar10 = (long)iVar13;
      local_1e0 = lVar10 * 3;
      uVar11 = (long)(&((local_1d0.
                         super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                       super__Vector_impl_data._M_finish)[local_1e8] -
               (long)(&((local_1d0.
                         super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                       super__Vector_impl_data._M_start)[local_1e8];
      iVar24 = (int)((ulong)((long)local_1d0.
                                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[lVar10].
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_1d0.
                                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[lVar10].
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 3);
      iVar6 = (int)(uVar11 >> 3);
      iVar16 = iVar24 + iVar6;
      local_1f4 = iVar17;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1b0,(long)iVar16,
                 &local_209);
      ppuVar1 = &(pvVar8->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                 .super__Vector_impl_data._M_start + lVar21;
      sVar12 = (long)ppuVar1[1] - (long)*ppuVar1;
      if (sVar12 != 0) {
        memmove((void *)local_1b0,*ppuVar1,sVar12);
      }
      ppuVar2 = &(pvVar8->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                 .super__Vector_impl_data._M_start + local_1e0;
      puVar3 = *ppuVar2;
      sVar12 = (long)ppuVar2[1] - (long)puVar3;
      if (sVar12 != 0) {
        memmove((void *)((long)(qpTestLog **)local_1b0 + ((long)(uVar11 * 0x20000000) >> 0x1d)),
                puVar3,sVar12);
      }
      auVar20 = local_1b0;
      if (local_1b0 != (undefined1  [8])local_1a8) {
        uVar11 = (long)local_1a8 - (long)local_1b0 >> 3;
        lVar21 = 0x3f;
        if (uVar11 != 0) {
          for (; uVar11 >> lVar21 == 0; lVar21 = lVar21 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (local_1b0,local_1a8,((uint)lVar21 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (auVar20);
      }
      uVar25 = (uint)((ulong)((long)ppuVar1[1] - (long)*ppuVar1) >> 3);
      if ((int)uVar25 < 1) {
        fVar30 = 0.0;
      }
      else {
        uVar11 = (long)local_1a8 - (long)local_1b0 >> 3;
        fVar30 = 0.0;
        uVar15 = 0;
        do {
          auVar20 = local_1b0;
          if ((long)uVar11 < 1) {
            iVar17 = 1;
          }
          else {
            pqVar5 = (qpTestLog *)(*ppuVar1)[uVar15];
            fVar26 = (float)pqVar5;
            auVar18 = local_1b0;
            uVar22 = uVar11;
            do {
              uVar19 = uVar22 >> 1;
              fVar29 = (float)((TestLog *)((long)auVar18 + uVar19 * 8))->m_log;
              fVar28 = fVar29 - fVar26;
              fVar27 = -fVar28;
              if (-fVar28 <= fVar28) {
                fVar27 = fVar28;
              }
              if (((TestLog *)((long)auVar18 + uVar19 * 8))->m_log < pqVar5 &&
                  ((fVar29 * 0.15 < fVar27 && fVar26 * 0.15 < fVar27) && 100.0 < fVar27)) {
                auVar18 = (undefined1  [8])((long)auVar18 + (uVar19 + 1) * 8);
                uVar19 = ~uVar19 + uVar22;
              }
              uVar22 = uVar19;
              uVar23 = uVar11;
            } while (0 < (long)uVar19);
            do {
              uVar22 = uVar23 >> 1;
              fVar27 = (float)((TestLog *)((long)auVar20 + uVar22 * 8))->m_log;
              fVar28 = fVar26 - fVar27;
              fVar29 = -fVar28;
              if (-fVar28 <= fVar28) {
                fVar29 = fVar28;
              }
              if (((TestLog *)((long)auVar20 + uVar22 * 8))->m_log <= pqVar5 ||
                  ((fVar29 <= fVar26 * 0.15 || fVar29 <= fVar27 * 0.15) || fVar29 <= 100.0)) {
                auVar20 = (undefined1  [8])((long)auVar20 + (uVar22 + 1) * 8);
                uVar22 = ~uVar22 + uVar23;
              }
              uVar23 = uVar22;
            } while (0 < (long)uVar22);
            iVar17 = (int)((ulong)((long)auVar18 - (long)local_1b0) >> 3) + 1;
          }
          fVar30 = fVar30 + (float)((int)((ulong)((long)auVar20 - (long)local_1b0) >> 3) + iVar17) *
                            0.5;
          uVar15 = uVar15 + 1;
        } while (uVar15 != (uVar25 & 0x7fffffff));
      }
      iVar24 = iVar24 * iVar6;
      fVar26 = (float)((iVar16 + 1) * iVar24) / 12.0;
      local_208._0_4_ = fVar30;
      if (fVar26 < 0.0) {
        fVar26 = sqrtf(fVar26);
        fVar30 = (float)local_208._0_4_;
      }
      else {
        fVar26 = SQRT(fVar26);
      }
      this = local_1b8;
      if (local_1b0 != (undefined1  [8])0x0) {
        operator_delete((void *)local_1b0,(long)local_1a0 - (long)local_1b0);
        fVar30 = (float)local_208._0_4_;
      }
      iVar16 = local_1d4;
      fVar30 = (float)(((iVar6 + 1) * iVar6) / 2 + iVar24) - fVar30;
      fVar27 = (float)iVar24 - fVar30;
      uVar25 = -(uint)(fVar30 <= fVar27);
      fVar26 = ((float)iVar24 * -0.5 + (float)(~uVar25 & (uint)fVar27 | (uint)fVar30 & uVar25)) /
               fVar26;
      fVar30 = -fVar26;
      if (-fVar26 <= fVar26) {
        fVar30 = fVar26;
      }
    } while (fVar30 <= 1.96);
    local_208 = ZEXT416((uint)fVar26);
    if (local_1f8 == this->m_numMaxSwaps) {
      local_1b0 = (undefined1  [8])
                  ((this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.
                   super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      lVar21 = local_1e8;
      pcVar7 = local_1f0;
      if (local_1f0 == (char *)0x0) {
        std::ios::clear((int)&local_1a8 + (int)local_1a8[-3].m_log);
      }
      else {
        sVar12 = strlen(local_1f0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar7,sVar12);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,": Samples with swap count ",0x1a);
      std::ostream::operator<<((ostream *)&local_1a8,iVar16);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," and ",5);
      std::ostream::operator<<((ostream *)&local_1a8,iVar13);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8," do not seem to have the same distribution:\n",0x2c);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,"\tDifference in standard deviations: ",0x24);
      std::ostream::_M_insert<double>((double)(float)local_208._0_4_);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\tSwap count ",0xc);
      std::ostream::operator<<((ostream *)&local_1a8,iVar16);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," median: ",9);
      puVar3 = (&((local_1d0.
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start)[lVar21];
      fVar30 = (float)(((long)(&((local_1d0.
                                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                _M_impl.super__Vector_impl_data._M_finish)[lVar21] - (long)puVar3 >>
                       3) - 1) * 0.5;
      local_208._0_4_ = fVar30;
      fVar30 = floorf(fVar30);
      std::ostream::_M_insert<double>
                ((double)(((float)local_208._0_4_ - (float)(int)fVar30) *
                          (float)puVar3[(int)fVar30 + 1] +
                         (float)puVar3[(int)fVar30] *
                         (1.0 - ((float)local_208._0_4_ - (float)(int)fVar30))));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\tSwap count ",0xc);
      std::ostream::operator<<((ostream *)&local_1a8,iVar13);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," median: ",9);
      puVar3 = (&((local_1d0.
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start)[local_1e0];
      local_208._0_4_ =
           (float)(((long)(&((local_1d0.
                              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                            _M_impl.super__Vector_impl_data._M_finish)[local_1e0] - (long)puVar3 >>
                   3) - 1) * 0.5;
      fVar30 = floorf((float)local_208._0_4_);
      std::ostream::_M_insert<double>
                ((double)(((float)local_208._0_4_ - (float)(int)fVar30) *
                          (float)puVar3[(int)fVar30 + 1] +
                         (float)puVar3[(int)fVar30] *
                         (1.0 - ((float)local_208._0_4_ - (float)(int)fVar30))));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
      iVar17 = local_1f4;
      iVar24 = -1;
    }
    else {
      local_1b0 = (undefined1  [8])
                  ((this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.
                   super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      lVar21 = local_1e8;
      pcVar7 = local_1f0;
      if (local_1f0 == (char *)0x0) {
        std::ios::clear((int)&local_1a8 + (int)local_1a8[-3].m_log);
      }
      else {
        sVar12 = strlen(local_1f0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar7,sVar12);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,": Samples with swap count ",0x1a);
      std::ostream::operator<<((ostream *)&local_1a8,iVar16);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," and ",5);
      std::ostream::operator<<((ostream *)&local_1a8,iVar13);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8," do not seem to have the same distribution:\n",0x2c);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,"\tSamples with swap count ",0x19);
      std::ostream::operator<<((ostream *)&local_1a8,iVar16);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8," are not part of the tail of stable results.\n",0x2d);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,"\tDifference in standard deviations: ",0x24);
      std::ostream::_M_insert<double>((double)(float)local_208._0_4_);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\tSwap count ",0xc);
      std::ostream::operator<<((ostream *)&local_1a8,iVar16);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," median: ",9);
      puVar3 = (&((local_1d0.
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start)[lVar21];
      fVar30 = (float)(((long)(&((local_1d0.
                                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                _M_impl.super__Vector_impl_data._M_finish)[lVar21] - (long)puVar3 >>
                       3) - 1) * 0.5;
      local_208._0_4_ = fVar30;
      fVar30 = floorf(fVar30);
      std::ostream::_M_insert<double>
                ((double)(((float)local_208._0_4_ - (float)(int)fVar30) *
                          (float)puVar3[(int)fVar30 + 1] +
                         (float)puVar3[(int)fVar30] *
                         (1.0 - ((float)local_208._0_4_ - (float)(int)fVar30))));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\tSwap count ",0xc);
      std::ostream::operator<<((ostream *)&local_1a8,iVar13);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," median: ",9);
      puVar3 = (&((local_1d0.
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start)[local_1e0];
      local_208._0_4_ =
           (float)(((long)(&((local_1d0.
                              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                            _M_impl.super__Vector_impl_data._M_finish)[local_1e0] - (long)puVar3 >>
                   3) - 1) * 0.5;
      fVar30 = floorf((float)local_208._0_4_);
      std::ostream::_M_insert<double>
                ((double)(((float)local_208._0_4_ - (float)(int)fVar30) *
                          (float)puVar3[(int)fVar30 + 1] +
                         (float)puVar3[(int)fVar30] *
                         (1.0 - ((float)local_208._0_4_ - (float)(int)fVar30))));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
      iVar17 = local_1f4;
      iVar24 = local_1f8;
    }
LAB_00748c49:
    local_1d8 = iVar24;
  } while (iVar17 < iVar13);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&local_1d0);
  return iVar24;
}

Assistant:

int UploadWaitDrawCase::findStabilizationSample (deUint64 (UploadWaitDrawCase::Result::*target), const char* description)
{
	std::vector<std::vector<deUint64> >	sampleObservations(m_numMaxSwaps+1);
	ThresholdComparer<deUint64>			comparer;

	comparer.relativeThreshold = 0.15f;	// 15%
	comparer.absoluteThreshold = 100;	// (us), assumed sampling precision

	// get observations and order them

	for (int swapNdx = 0; swapNdx <= m_numMaxSwaps; ++swapNdx)
	{
		int insertNdx = 0;

		sampleObservations[swapNdx].resize(m_numSamplesPerSwap);

		for (int ndx = 0; ndx < (int)m_samples.size(); ++ndx)
			if (m_samples[ndx].numFrames == swapNdx)
				sampleObservations[swapNdx][insertNdx++] = m_results[ndx].*target;

		DE_ASSERT(insertNdx == m_numSamplesPerSwap);

		std::sort(sampleObservations[swapNdx].begin(), sampleObservations[swapNdx].end());
	}

	// find stabilization point

	for (int sampleNdx = m_numMaxSwaps-1; sampleNdx != -1; --sampleNdx )
	{
		// Distribution is equal to all following distributions
		for (int cmpTargetDistribution = sampleNdx+1; cmpTargetDistribution <= m_numMaxSwaps; ++cmpTargetDistribution)
		{
			// Stable section ends here?
			const DistributionCompareResult result = distributionCompare(sampleObservations[sampleNdx], sampleObservations[cmpTargetDistribution], comparer);
			if (!result.equal)
			{
				// Last two samples are not equal? Samples never stabilized
				if (sampleNdx == m_numMaxSwaps-1)
				{
					m_testCtx.getLog()
						<< tcu::TestLog::Message
						<< description << ": Samples with swap count " << sampleNdx << " and " << cmpTargetDistribution << " do not seem to have the same distribution:\n"
						<< "\tDifference in standard deviations: " << result.standardDeviations << "\n"
						<< "\tSwap count " << sampleNdx << " median: " << linearSample(sampleObservations[sampleNdx], 0.5f) << "\n"
						<< "\tSwap count " << cmpTargetDistribution << " median: " << linearSample(sampleObservations[cmpTargetDistribution], 0.5f) << "\n"
						<< tcu::TestLog::EndMessage;
					return -1;
				}
				else
				{
					m_testCtx.getLog()
						<< tcu::TestLog::Message
						<< description << ": Samples with swap count " << sampleNdx << " and " << cmpTargetDistribution << " do not seem to have the same distribution:\n"
						<< "\tSamples with swap count " << sampleNdx << " are not part of the tail of stable results.\n"
						<< "\tDifference in standard deviations: " << result.standardDeviations << "\n"
						<< "\tSwap count " << sampleNdx << " median: " << linearSample(sampleObservations[sampleNdx], 0.5f) << "\n"
						<< "\tSwap count " << cmpTargetDistribution << " median: " << linearSample(sampleObservations[cmpTargetDistribution], 0.5f) << "\n"
						<< tcu::TestLog::EndMessage;

					return sampleNdx+1;
				}
			}
		}
	}

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< description << ": All samples seem to have the same distribution"
		<< tcu::TestLog::EndMessage;

	// all distributions equal
	return 0;
}